

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.c
# Opt level: O0

int sat_solver_solve_internal(sat_solver *s)

{
  int iVar1;
  abctime aVar2;
  double dVar3;
  double local_38;
  int local_2c;
  int v;
  double Ratio;
  ABC_INT64_T nof_conflicts;
  int restart_iter;
  lbool status;
  sat_solver *s_local;
  
  nof_conflicts._7_1_ = '\0';
  nof_conflicts._0_4_ = 0;
  veci_resize(&s->unit_lits,0);
  s->nCalls = s->nCalls + 1;
  if (0 < s->verbosity) {
    printf("==================================[MINISAT]===================================\n");
    printf("| Conflicts |     ORIGINAL     |              LEARNT              | Progress |\n");
    printf("|           | Clauses Literals |   Limit Clauses Literals  Lit/Cl |          |\n");
    printf("==============================================================================\n");
  }
  while (nof_conflicts._7_1_ == '\0') {
    if ((s->stats).learnts == 0) {
      local_38 = 0.0;
    }
    else {
      local_38 = (double)(s->stats).learnts_literals / (double)(s->stats).learnts;
    }
    if ((s->nRuntimeLimit != 0) && (aVar2 = Abc_Clock(), s->nRuntimeLimit < aVar2)) break;
    if (0 < s->verbosity) {
      printf("| %9.0f | %7.0f %8.0f | %7.0f %7.0f %8.0f %7.1f | %6.3f %% |\n",
             (double)(s->stats).conflicts,(double)(s->stats).clauses,
             (double)(s->stats).clauses_literals,0,(double)(s->stats).learnts,
             (double)(s->stats).learnts_literals,local_38,s->progress_estimate * 100.0);
      fflush(_stdout);
    }
    iVar1 = (int)nof_conflicts + 1;
    dVar3 = luby(2.0,(int)nof_conflicts);
    nof_conflicts._7_1_ = sat_solver_search(s,(long)(dVar3 * 100.0));
    if (((((s->nConfLimit != 0) && (s->nConfLimit < (s->stats).conflicts)) ||
         ((s->nInsLimit != 0 && (s->nInsLimit < (s->stats).propagations)))) ||
        ((s->nRuntimeLimit != 0 && (aVar2 = Abc_Clock(), s->nRuntimeLimit < aVar2)))) ||
       ((nof_conflicts._0_4_ = iVar1, s->pFuncStop != (_func_int_int *)0x0 &&
        (iVar1 = (*s->pFuncStop)(s->RunId), iVar1 != 0)))) break;
  }
  if (0 < s->verbosity) {
    printf("==============================================================================\n");
  }
  sat_solver_canceluntil(s,s->root_level);
  if ((nof_conflicts._7_1_ == '\x01') && ((s->user_vars).size != 0)) {
    for (local_2c = 0; local_2c < (s->user_vars).size; local_2c = local_2c + 1) {
      iVar1 = sat_solver_var_value(s,(s->user_vars).ptr[local_2c]);
      veci_push(&s->user_values,iVar1);
    }
  }
  return (int)nof_conflicts._7_1_;
}

Assistant:

int sat_solver_solve_internal(sat_solver* s)
{
    lbool status = l_Undef;
    int restart_iter = 0;
    veci_resize(&s->unit_lits, 0);
    s->nCalls++;

    if (s->verbosity >= 1){
        printf("==================================[MINISAT]===================================\n");
        printf("| Conflicts |     ORIGINAL     |              LEARNT              | Progress |\n");
        printf("|           | Clauses Literals |   Limit Clauses Literals  Lit/Cl |          |\n");
        printf("==============================================================================\n");
    }

    while (status == l_Undef){
        ABC_INT64_T nof_conflicts;
        double Ratio = (s->stats.learnts == 0)? 0.0 :
            s->stats.learnts_literals / (double)s->stats.learnts;
        if ( s->nRuntimeLimit && Abc_Clock() > s->nRuntimeLimit )
            break;
        if (s->verbosity >= 1)
        {
            printf("| %9.0f | %7.0f %8.0f | %7.0f %7.0f %8.0f %7.1f | %6.3f %% |\n", 
                (double)s->stats.conflicts,
                (double)s->stats.clauses, 
                (double)s->stats.clauses_literals,
                (double)0, 
                (double)s->stats.learnts, 
                (double)s->stats.learnts_literals,
                Ratio,
                s->progress_estimate*100);
            fflush(stdout);
        }
        nof_conflicts = (ABC_INT64_T)( 100 * luby(2, restart_iter++) );
        status = sat_solver_search(s, nof_conflicts);
        // quit the loop if reached an external limit
        if ( s->nConfLimit && s->stats.conflicts > s->nConfLimit )
            break;
        if ( s->nInsLimit  && s->stats.propagations > s->nInsLimit )
            break;
        if ( s->nRuntimeLimit && Abc_Clock() > s->nRuntimeLimit )
            break;
        if ( s->pFuncStop && s->pFuncStop(s->RunId) )
            break;
    }
    if (s->verbosity >= 1)
        printf("==============================================================================\n");

    sat_solver_canceluntil(s,s->root_level);
    // save variable values
    if ( status == l_True && s->user_vars.size )
    {
        int v;
        for ( v = 0; v < s->user_vars.size; v++ )
            veci_push(&s->user_values, sat_solver_var_value(s, s->user_vars.ptr[v]));
    }
    return status;
}